

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O0

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::TableFunctionData::Copy(TableFunctionData *this)

{
  string *msg;
  allocator *this_00;
  allocator local_31;
  string local_30 [48];
  
  msg = (string *)__cxa_allocate_exception(0x10);
  this_00 = &local_31;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_30,"Copy not supported for TableFunctionData",this_00);
  InternalException::InternalException((InternalException *)this_00,msg);
  __cxa_throw(msg,&InternalException::typeinfo,InternalException::~InternalException);
}

Assistant:

unique_ptr<FunctionData> TableFunctionData::Copy() const {
	throw InternalException("Copy not supported for TableFunctionData");
}